

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> *
__thiscall helics::CommonCore::getLocalEndpoint(CommonCore *this,string_view name)

{
  BasicHandleInfo *pBVar1;
  shared_lock<std::shared_mutex> local_28;
  
  local_28._M_pm = &(this->handles).m_mutex;
  local_28._M_owns = true;
  std::__shared_mutex_pthread::lock_shared(&(local_28._M_pm)->_M_impl);
  pBVar1 = HandleManager::getInterfaceHandle(&(this->handles).m_obj,name,ENDPOINT);
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_28);
  return (_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)pBVar1;
}

Assistant:

const BasicHandleInfo* CommonCore::getLocalEndpoint(std::string_view name) const
{
    return handles.read(
        [&name](auto& hand) { return hand.getInterfaceHandle(name, InterfaceType::ENDPOINT); });
}